

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextdocument_p.cpp
# Opt level: O2

void __thiscall
QTextDocumentPrivate::move(QTextDocumentPrivate *this,int pos,int to,int length,Operation op)

{
  FragmentMap *this_00;
  BlockMap *this_01;
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  QTextFragmentData *pQVar5;
  Header *pHVar6;
  uint uVar7;
  uint n;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  uint uVar12;
  long lVar13;
  long in_FS_OFFSET;
  bool bVar14;
  QTextUndoCommand local_78;
  QTextUndoCommand local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (pos != to) {
    split(this,pos);
    split(this,length + pos);
    uVar10 = 0;
    uVar7 = 0;
    if (to != -1) {
      uVar7 = QFragmentMapData<QTextFragmentData>::findNode(&(this->fragments).data,to,0);
      uVar7 = QFragmentMapData<QTextFragmentData>::position(&(this->fragments).data,uVar7,0);
    }
    this_00 = &this->fragments;
    n = QFragmentMapData<QTextFragmentData>::findNode(&this_00->data,pos,0);
    uVar8 = QFragmentMapData<QTextFragmentData>::findNode(&this_00->data,length + pos,0);
    this_01 = &this->blocks;
    while (n != uVar8) {
      uVar9 = QFragmentMapData<QTextFragmentData>::next(&this_00->data,n);
      uVar10 = QFragmentMapData<QTextFragmentData>::position(&this_00->data,n,0);
      uVar11 = QFragmentMapData<QTextBlockData>::findNode(&this_01->data,uVar10 + 1,0);
      pQVar5 = (this->fragments).data.field_0.fragments;
      pHVar6 = (this->blocks).data.field_0.head;
      local_58.revision = *(int *)((long)pHVar6 + (ulong)uVar11 * 0x48 + 0x44) * 2 >> 1;
      local_58.command = 1;
      local_78._2_1_ = this->editBlock != 0;
      local_78.operation = (quint8)op;
      uVar1 = pQVar5[n].stringPosition;
      uVar3 = pQVar5[n].format;
      local_58.field_8._4_4_ = 0xaaaaaaaa;
      local_58.field_8.blockFormat = pQVar5[n].super_QFragment<1>.size_array[0];
      local_58._28_4_ = 0xaaaaaaaa;
      local_78.command = 0;
      uVar2 = pQVar5[n].stringPosition;
      uVar4 = pQVar5[n].format;
      local_78.field_8._4_4_ = 0xaaaaaaaa;
      local_78.field_8.blockFormat = pQVar5[n].super_QFragment<1>.size_array[0];
      local_78._28_4_ = 0xaaaaaaaa;
      local_78.revision = local_58.revision;
      local_78.format = uVar4;
      local_78.strPos = uVar2;
      local_78.pos = uVar7;
      local_58._2_1_ = local_78._2_1_;
      local_58.operation = local_78.operation;
      local_58.format = uVar3;
      local_58.strPos = uVar1;
      local_58.pos = uVar10;
      uVar12 = QFragmentMapData<QTextBlockData>::position(&this_01->data,uVar11,0);
      if (uVar10 + 1 == uVar12) {
        uVar11 = QFragmentMapData<QTextBlockData>::previous(&this_01->data,uVar11);
        bVar14 = (this->blocks).data.field_0.fragments[uVar11].super_QFragment<3>.size_array[0] == 1
        ;
        local_58.command = bVar14 + 5 + (ushort)bVar14;
        uVar10 = remove_block(this,uVar10,&local_58.field_8.blockFormat,6,op);
        if (to != -1) {
          insert_block(this,uVar7,pQVar5[n].stringPosition,pQVar5[n].format,
                       local_58.field_8.blockFormat,op,5);
          bVar14 = (this->blocks).data.field_0.fragments[uVar11].super_QFragment<3>.size_array[0] ==
                   1;
          local_78.command = bVar14 + 4 + (ushort)bVar14;
          local_78.field_8.blockFormat = local_58.field_8.blockFormat;
          uVar7 = uVar7 + 1;
        }
        lVar13 = 0;
      }
      else {
        lVar13 = (long)pHVar6 + (ulong)uVar11 * 0x48;
        uVar10 = remove_string(this,uVar10,pQVar5[n].super_QFragment<1>.size_array[0],op);
        if (to != -1) {
          insert_string(this,uVar7,pQVar5[n].stringPosition,
                        pQVar5[n].super_QFragment<1>.size_array[0],pQVar5[n].format,op);
          uVar7 = uVar7 + pQVar5[n].super_QFragment<1>.size_array[0];
        }
      }
      appendUndoItem(this,&local_58);
      if (lVar13 != 0) {
        *(uint *)(lVar13 + 0x44) =
             *(uint *)(lVar13 + 0x44) & 0x80000000 | this->revision & 0x7fffffffU;
      }
      n = uVar9;
      if (to != -1) {
        appendUndoItem(this,&local_78);
      }
    }
    if (uVar10 != 0) {
      unite(this,uVar10);
    }
    if ((this->field_0x294 & 2) == 0) {
      finishEdit(this);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QTextDocumentPrivate::move(int pos, int to, int length, QTextUndoCommand::Operation op)
{
    Q_ASSERT(to <= fragments.length() && to <= pos);
    Q_ASSERT(pos >= 0 && pos+length <= fragments.length());
    Q_ASSERT(blocks.length() == fragments.length());

    if (pos == to)
        return;

    const bool needsInsert = to != -1;

#if !defined(QT_NO_DEBUG)
    const bool startAndEndInSameFrame = (frameAt(pos) == frameAt(pos + length - 1));

    const bool endIsEndOfChildFrame = (isAncestorFrame(frameAt(pos), frameAt(pos + length - 1))
                                       && text.at(find(pos + length - 1)->stringPosition) == QTextEndOfFrame);

    const bool startIsStartOfFrameAndEndIsEndOfFrameWithCommonParent
               = (text.at(find(pos)->stringPosition) == QTextBeginningOfFrame
                  && text.at(find(pos + length - 1)->stringPosition) == QTextEndOfFrame
                  && frameAt(pos)->parentFrame() == frameAt(pos + length - 1)->parentFrame());

    const bool isFirstTableCell = (qobject_cast<QTextTable *>(frameAt(pos + length - 1))
                                  && frameAt(pos + length - 1)->parentFrame() == frameAt(pos));

    Q_ASSERT(startAndEndInSameFrame || endIsEndOfChildFrame || startIsStartOfFrameAndEndIsEndOfFrameWithCommonParent || isFirstTableCell);
#endif

    split(pos);
    split(pos+length);

    uint dst = needsInsert ? fragments.findNode(to) : 0;
    uint dstKey = needsInsert ? fragments.position(dst) : 0;

    uint x = fragments.findNode(pos);
    uint end = fragments.findNode(pos+length);

    uint w = 0;
    while (x != end) {
        uint n = fragments.next(x);

        uint key = fragments.position(x);
        uint b = blocks.findNode(key+1);
        QTextBlockData *B = blocks.fragment(b);
        int blockRevision = B->revision;

        QTextFragmentData *X = fragments.fragment(x);
        QT_INIT_TEXTUNDOCOMMAND(c, QTextUndoCommand::Removed, (editBlock != 0),
                                op, X->format, X->stringPosition, key, X->size_array[0],
                                blockRevision);
        QT_INIT_TEXTUNDOCOMMAND(cInsert, QTextUndoCommand::Inserted, (editBlock != 0),
                                op, X->format, X->stringPosition, dstKey, X->size_array[0],
                                blockRevision);

        if (key+1 != blocks.position(b)) {
//          qDebug("remove_string from %d length %d", key, X->size_array[0]);
            Q_ASSERT(noBlockInString(QStringView{text}.mid(X->stringPosition, X->size_array[0])));
            w = remove_string(key, X->size_array[0], op);

            if (needsInsert) {
                insert_string(dstKey, X->stringPosition, X->size_array[0], X->format, op);
                dstKey += X->size_array[0];
            }
        } else {
//          qDebug("remove_block at %d", key);
            Q_ASSERT(X->size_array[0] == 1 && isValidBlockSeparator(text.at(X->stringPosition)));
            b = blocks.previous(b);
            B = nullptr;
            c.command = blocks.size(b) == 1 ? QTextUndoCommand::BlockDeleted : QTextUndoCommand::BlockRemoved;
            w = remove_block(key, &c.blockFormat, QTextUndoCommand::BlockAdded, op);

            if (needsInsert) {
                insert_block(dstKey++, X->stringPosition, X->format, c.blockFormat, op, QTextUndoCommand::BlockRemoved);
                cInsert.command = blocks.size(b) == 1 ? QTextUndoCommand::BlockAdded : QTextUndoCommand::BlockInserted;
                cInsert.blockFormat = c.blockFormat;
            }
        }
        appendUndoItem(c);
        if (B)
            B->revision = revision;
        x = n;

        if (needsInsert)
            appendUndoItem(cInsert);
    }
    if (w)
        unite(w);

    Q_ASSERT(blocks.length() == fragments.length());

    if (!blockCursorAdjustment)
        finishEdit();
}